

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O1

void Abc_SclTimeNode(SC_Man *p,Abc_Obj_t *pObj,int fDept)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  SC_Pair *pSVar4;
  SC_Pair *pSVar5;
  SC_Pair *pSVar6;
  SC_Pair *pSVar7;
  Vec_Int_t *pVVar8;
  void *pvVar9;
  Abc_Obj_t *pFanin;
  uint uVar10;
  SC_Timing *pSVar11;
  char *__function;
  char *__file;
  SC_Cell *pSVar12;
  long lVar13;
  float fVar14;
  float fVar15;
  double dVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  SC_Pair SlewIn;
  SC_Pair ArrOut1;
  SC_Pair ArrOut0;
  SC_Pair ArrIn;
  SC_Pair LoadIn;
  SC_Pair local_60;
  SC_Pair local_58;
  SC_Pair local_50;
  SC_Pair local_48;
  SC_Pair local_40;
  SC_Pair local_38;
  
  pSVar4 = p->pLoads;
  uVar2 = pObj->Id;
  fVar15 = pSVar4[uVar2].rise;
  fVar1 = pSVar4[uVar2].fall;
  fVar14 = p->EstLoadMax;
  fVar17 = 0.0;
  if ((fVar14 != 0.0) || (NAN(fVar14))) {
    fVar17 = (fVar1 * 0.5 + fVar15 * 0.5) / (p->EstLoadAve * fVar14);
  }
  pSVar4 = pSVar4 + uVar2;
  uVar10 = *(uint *)&pObj->field_0x14 & 0xf;
  if ((uVar10 == 5) || (uVar10 == 2)) {
    if (fDept != 0) {
      __assert_fail("!fDept",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclSize.c"
                    ,0x142,"void Abc_SclTimeNode(SC_Man *, Abc_Obj_t *, int)");
    }
    pSVar12 = p->pPiDrive;
    if (pSVar12 != (SC_Cell *)0x0) {
      pSVar5 = p->pTimes;
      pSVar6 = p->pSlews;
      local_38.rise = 0.0;
      local_38.fall = 0.0;
      local_40.rise = 0.0;
      local_40.fall = 0.0;
      local_60.rise = 0.0;
      local_60.fall = 0.0;
      local_48.rise = 0.0;
      local_48.fall = 0.0;
      local_50.rise = 0.0;
      local_50.fall = 0.0;
      local_58.rise = 0.0;
      local_58.fall = 0.0;
      pSVar7 = pSVar6 + uVar2;
      pSVar7->rise = 0.0;
      pSVar7->fall = 0.0;
      if (pSVar12->n_inputs != 1) {
        __assert_fail("pCell->n_inputs == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLib.h"
                      ,0x2ad,
                      "void Scl_LibHandleInputDriver(SC_Cell *, SC_Pair *, SC_Pair *, SC_Pair *)");
      }
      pSVar11 = Scl_CellPinTime(pSVar12,0);
      Scl_LibPinArrival(pSVar11,&local_40,&local_60,&local_38,&local_48,&local_58);
      pSVar11 = Scl_CellPinTime(pSVar12,0);
      Scl_LibPinArrival(pSVar11,&local_40,&local_60,pSVar4,&local_50,pSVar6 + uVar2);
      pSVar5[uVar2].fall = local_50.fall - local_48.fall;
      pSVar5[uVar2].rise = local_50.rise - local_48.rise;
    }
  }
  else {
    if (uVar10 - 5 < 0xfffffffe) {
      if (uVar10 != 7) {
        __assert_fail("Abc_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclSize.c"
                      ,0x150,"void Abc_SclTimeNode(SC_Man *, Abc_Obj_t *, int)");
      }
      fVar18 = 0.0;
      if ((fVar14 != 0.0) || (NAN(fVar14))) {
        fVar19 = 0.0;
        fVar18 = 0.0;
        if (1.0 < fVar17) {
          fVar14 = fVar14 * p->EstLoadAve;
          pSVar4->rise = fVar14;
          pSVar4->fall = fVar14;
          fVar19 = 0.0;
          if (fDept != 0) {
            pSVar7 = p->pDepts;
            fVar14 = p->EstLinear;
            dVar16 = log((double)fVar17);
            fVar14 = (float)(dVar16 * (double)fVar14);
            fVar19 = pSVar7[uVar2].rise;
            fVar18 = pSVar7[uVar2].fall;
            pSVar7[uVar2].rise = fVar19 + fVar14;
            pSVar7[uVar2].fall = fVar14 + fVar18;
          }
          p->nEstNodes = p->nEstNodes + 1;
        }
      }
      else {
        fVar19 = 0.0;
      }
      iVar3 = pObj->Id;
      if (-1 < (long)iVar3) {
        pVVar8 = pObj->pNtk->vGates;
        if (iVar3 < pVVar8->nSize) {
          uVar2 = pVVar8->pArray[iVar3];
          if ((ulong)uVar2 == 0xffffffff) {
            pSVar12 = (SC_Cell *)0x0;
          }
          else {
            if (((int)uVar2 < 0) ||
               (pvVar9 = pObj->pNtk->pSCLib, *(int *)((long)pvVar9 + 100) <= (int)uVar2)) {
              __file = 
              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
              ;
              __function = "void *Vec_PtrEntry(Vec_Ptr_t *, int)";
              goto LAB_003f58d4;
            }
            pSVar12 = *(SC_Cell **)(*(long *)((long)pvVar9 + 0x68) + (ulong)uVar2 * 8);
          }
          if (0 < (pObj->vFanins).nSize) {
            lVar13 = 0;
            do {
              pFanin = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar13]];
              pSVar11 = Scl_CellPinTime(pSVar12,(int)lVar13);
              if (fDept == 0) {
                uVar2 = pFanin->Id;
                uVar10 = pObj->Id;
                Scl_LibPinArrival(pSVar11,p->pTimes + uVar2,p->pSlews + uVar2,p->pLoads + uVar10,
                                  p->pTimes + uVar10,p->pSlews + uVar10);
              }
              else {
                Abc_SclDeptFanin(p,pSVar11,pObj,pFanin);
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 < (pObj->vFanins).nSize);
          }
          if ((p->EstLoadMax == 0.0) && (!NAN(p->EstLoadMax))) {
            return;
          }
          if (fVar17 <= 1.0) {
            return;
          }
          pSVar4->rise = fVar15;
          pSVar4->fall = fVar1;
          uVar2 = pObj->Id;
          if (fDept != 0) {
            pSVar4 = p->pDepts;
            pSVar4[uVar2].rise = fVar19;
            pSVar4[uVar2].fall = fVar18;
            return;
          }
          pSVar4 = p->pTimes;
          fVar15 = p->EstLinear;
          dVar16 = log((double)fVar17);
          fVar15 = (float)(dVar16 * (double)fVar15);
          pSVar4[uVar2].rise = pSVar4[uVar2].rise + fVar15;
          pSVar4[uVar2].fall = fVar15 + pSVar4[uVar2].fall;
          return;
        }
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if (fDept == 0) {
      if (uVar10 - 5 < 0xfffffffe) {
        __assert_fail("Abc_ObjIsCo(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclSize.h"
                      ,0x7f,"void Abc_SclObjDupFanin(SC_Man *, Abc_Obj_t *)");
      }
      p->pTimes[uVar2] =
           p->pTimes[*(uint *)((long)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray] + 0x10)];
      iVar3 = (pObj->field_5).iData;
      if ((-1 < (long)iVar3) && (iVar3 < p->vTimesOut->nSize)) {
        fVar15 = p->pTimes[(uint)pObj->Id].rise;
        fVar1 = p->pTimes[(uint)pObj->Id].fall;
        if (fVar15 <= fVar1) {
          fVar15 = fVar1;
        }
        p->vTimesOut->pArray[iVar3] = fVar15;
        Vec_QueUpdate(p->vQue,(pObj->field_5).iData);
        return;
      }
      __file = 
      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecFlt.h"
      ;
      __function = "void Vec_FltWriteEntry(Vec_Flt_t *, int, float)";
LAB_003f58d4:
      __assert_fail("i >= 0 && i < p->nSize",__file,0x184,__function);
    }
  }
  return;
}

Assistant:

void Abc_SclTimeNode( SC_Man * p, Abc_Obj_t * pObj, int fDept )
{
    SC_Timing * pTime;
    SC_Cell * pCell;
    int k;
    SC_Pair * pLoad = Abc_SclObjLoad( p, pObj );
    float LoadRise = pLoad->rise;
    float LoadFall = pLoad->fall;
    float DeptRise = 0;
    float DeptFall = 0;
    float Value = p->EstLoadMax ? Abc_SclObjLoadValue( p, pObj ) : 0;
    Abc_Obj_t * pFanin;
    if ( Abc_ObjIsCi(pObj) )
    {
        assert( !fDept );
        Abc_SclTimeCi( p, pObj );
        return;
    }
    if ( Abc_ObjIsCo(pObj) )
    {
        if ( !fDept )
        {
            Abc_SclObjDupFanin( p, pObj );
            Vec_FltWriteEntry( p->vTimesOut, pObj->iData, Abc_SclObjTimeMax(p, pObj) );
            Vec_QueUpdate( p->vQue, pObj->iData );
        }
        return;
    }
    assert( Abc_ObjIsNode(pObj) );
//    if ( !(Abc_ObjFaninNum(pObj) == 1 && Abc_ObjIsPi(Abc_ObjFanin0(pObj))) && p->EstLoadMax && Value > 1 )
    if ( p->EstLoadMax && Value > 1 )
    {
        pLoad->rise = p->EstLoadAve * p->EstLoadMax;
        pLoad->fall = p->EstLoadAve * p->EstLoadMax;
        if ( fDept )
        {
            SC_Pair * pDepOut  = Abc_SclObjDept( p, pObj );
            float EstDelta = p->EstLinear * log( Value );
            DeptRise = pDepOut->rise;
            DeptFall = pDepOut->fall;
            pDepOut->rise += EstDelta;
            pDepOut->fall += EstDelta;
        }
        p->nEstNodes++;
    }
    // get the library cell
    pCell = Abc_SclObjCell( pObj );
    // compute for each fanin
    Abc_ObjForEachFanin( pObj, pFanin, k )
    {
        pTime = Scl_CellPinTime( pCell, k );
        if ( fDept )
            Abc_SclDeptFanin( p, pTime, pObj, pFanin );
        else
            Abc_SclTimeFanin( p, pTime, pObj, pFanin );
    }
    if ( p->EstLoadMax && Value > 1 )
    {
        pLoad->rise = LoadRise;
        pLoad->fall = LoadFall;
        if ( fDept )
        {
            SC_Pair * pDepOut  = Abc_SclObjDept( p, pObj );
            pDepOut->rise = DeptRise;
            pDepOut->fall = DeptFall;
        }
        else
        {
            SC_Pair * pArrOut  = Abc_SclObjTime( p, pObj );
            float EstDelta = p->EstLinear * log( Value );
            pArrOut->rise += EstDelta;
            pArrOut->fall += EstDelta;
        }
    }
}